

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

char * mp_encode_strl(char *data,uint32_t len)

{
  char *pcVar1;
  uint32_t len_local;
  char *data_local;
  
  if (len < 0x20) {
    data_local = mp_store_u8(data,(byte)len | 0xa0);
  }
  else if (len < 0x100) {
    pcVar1 = mp_store_u8(data,0xd9);
    data_local = mp_store_u8(pcVar1,(byte)len);
  }
  else if (len < 0x10000) {
    pcVar1 = mp_store_u8(data,0xda);
    data_local = mp_store_u16(pcVar1,(uint16_t)len);
  }
  else {
    pcVar1 = mp_store_u8(data,0xdb);
    data_local = mp_store_u32(pcVar1,len);
  }
  return data_local;
}

Assistant:

MP_IMPL char *
mp_encode_strl(char *data, uint32_t len)
{
	if (len <= 31) {
		return mp_store_u8(data, 0xa0 | (uint8_t) len);
	} else if (len <= UINT8_MAX) {
		data = mp_store_u8(data, 0xd9);
		return mp_store_u8(data, len);
	} else if (len <= UINT16_MAX) {
		data = mp_store_u8(data, 0xda);
		return mp_store_u16(data, len);
	} else {
		data = mp_store_u8(data, 0xdb);
		return mp_store_u32(data, len);
	}
}